

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_transform.c
# Opt level: O1

void gdImageFlipHorizontal(gdImagePtr im)

{
  uchar uVar1;
  int iVar2;
  int **ppiVar3;
  int *piVar4;
  uchar *puVar5;
  long lVar6;
  uchar *puVar7;
  int *piVar8;
  long lVar9;
  
  if (im->trueColor == 0) {
    if (0 < im->sy) {
      lVar6 = 0;
      do {
        if (1 < (long)im->sx) {
          puVar5 = im->pixels[lVar6];
          puVar7 = puVar5 + im->sx;
          lVar9 = 0;
          do {
            puVar7 = puVar7 + -1;
            uVar1 = puVar5[lVar9];
            puVar5[lVar9] = *puVar7;
            *puVar7 = uVar1;
            lVar9 = lVar9 + 1;
          } while ((int)lVar9 < im->sx >> 1);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < im->sy);
    }
  }
  else if (0 < im->sy) {
    ppiVar3 = im->tpixels;
    lVar6 = 0;
    do {
      if (1 < (long)im->sx) {
        piVar4 = ppiVar3[lVar6];
        piVar8 = piVar4 + im->sx;
        lVar9 = 0;
        do {
          piVar8 = piVar8 + -1;
          iVar2 = piVar4[lVar9];
          piVar4[lVar9] = *piVar8;
          *piVar8 = iVar2;
          lVar9 = lVar9 + 1;
        } while ((int)lVar9 < im->sx >> 1);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < im->sy);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFlipHorizontal(gdImagePtr im)
{

	int x, y;

	if (im->trueColor) {
		int *px1, *px2, tmp;

		for (y = 0; y < im->sy; y++) {
			px1 = im->tpixels[y];
			px2 = im->tpixels[y] + im->sx - 1;
			for (x = 0; x < (im->sx >> 1); x++) {
				tmp = *px1;
				*px1 = *px2;
				*px2 = tmp;
				px1++;
				px2--;
			}
		}
	} else {
		unsigned char *px1, *px2, tmp;

		for (y = 0; y < im->sy; y++) {
			px1 = im->pixels[y];
			px2 = im->pixels[y] + im->sx - 1;
			for (x = 0; x < (im->sx >> 1); x++) {
				tmp = *px1;
				*px1 = *px2;
				*px2 = tmp;
				px1++;
				px2--;
			}
		}
	}
}